

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O2

void __thiscall
oqpi::local_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_>::local_sync_object<>
          (local_sync_object<oqpi::posix_event<oqpi::event_auto_reset_policy_impl>_> *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  posix_event<oqpi::event_auto_reset_policy_impl>::posix_event
            (&this->super_posix_event<oqpi::event_auto_reset_policy_impl>,&local_30,open_or_create);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

local_sync_object(_Args &&...args)
            : _Impl("", sync_object_creation_options::open_or_create, std::forward<_Args>(args)...)
        {}